

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall asmjit::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  BaseBuilder *pBVar7;
  long *plVar8;
  _func_int *p_Var9;
  byte *pbVar10;
  BaseNode *pBVar11;
  uint uVar12;
  Error EVar13;
  undefined4 uVar14;
  BaseNode *pBVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  Error local_5c;
  undefined4 local_40;
  uint32_t local_3c;
  undefined8 local_38;
  
  pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  uVar4._0_1_ = pBVar7[1].super_BaseEmitter._environment._arch;
  uVar4._1_1_ = pBVar7[1].super_BaseEmitter._environment._subArch;
  uVar4._2_1_ = pBVar7[1].super_BaseEmitter._environment._vendor;
  uVar4._3_1_ = pBVar7[1].super_BaseEmitter._environment._platform;
  do {
    if (first == stop) {
      return 0;
    }
    pBVar15 = (first->field_0).field_0._next;
    bVar20 = true;
    if (((first->field_1)._any._nodeFlags & 0x20) != 0) {
      plVar8 = (long *)first->_passData;
      bVar2 = (first->field_1)._any._reserved0;
      if (plVar8 == (long *)0x0) {
LAB_00137167:
        if (bVar2 == 0) {
          bVar20 = true;
        }
        else {
          pBVar7 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
          lVar16 = 0;
          do {
            uVar5 = *(uint *)((long)&first[1].field_1 + lVar16);
            bVar20 = true;
            if ((uVar5 & 0x2007) == 0x2002) {
              uVar17 = *(int *)((long)&first[1]._position + lVar16) - 0x100;
              bVar20 = uVar17 < uVar4;
              if (bVar20) {
                uVar12._0_1_ = pBVar7[1].super_BaseEmitter._environment._arch;
                uVar12._1_1_ = pBVar7[1].super_BaseEmitter._environment._subArch;
                uVar12._2_1_ = pBVar7[1].super_BaseEmitter._environment._vendor;
                uVar12._3_1_ = pBVar7[1].super_BaseEmitter._environment._platform;
                if (uVar17 < uVar12) {
                  p_Var9 = pBVar7[1].super_BaseEmitter._errorHandler[uVar17]._vptr_ErrorHandler[4];
                  if (p_Var9 != (_func_int *)0x0) {
                    pbVar10 = *(byte **)(p_Var9 + 0x18);
                    iVar6 = *(int *)(pbVar10 + 0x10);
                    uVar17 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature;
                    *(uint *)((long)&first[1]._position + lVar16) = (uint)*pbVar10;
                    *(uint *)((long)&first[1].field_1 + lVar16) = uVar5 & 0xffffdf02 | uVar17 & 0xf8
                    ;
                    piVar1 = (int *)((long)&first[1].field_3 + lVar16 + 4);
                    *piVar1 = *piVar1 + iVar6;
                    goto LAB_001371f8;
                  }
                }
                else {
                  _rewrite();
                }
                _rewrite();
                goto LAB_00137308;
              }
              local_5c = 0x1f;
            }
LAB_001371f8:
          } while ((bVar20) &&
                  (bVar21 = (ulong)bVar2 * 0x10 + -0x10 != lVar16, lVar16 = lVar16 + 0x10, bVar21));
        }
      }
      else {
        uVar5 = *(uint *)((long)plVar8 + 0xc);
        bVar19 = false;
        if ((ulong)uVar5 != 0) {
          uVar18 = 0;
          do {
            uVar17 = *(uint *)((long)plVar8 + uVar18 * 0x18 + 0x54);
            if (uVar17 != 0) {
              bVar3 = *(byte *)((long)plVar8 + uVar18 * 0x18 + 0x5d);
              do {
                if (bVar19 <= bVar3) {
                  bVar19 = bVar3;
                }
                uVar12 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                *(uint *)((long)&first[1].field_0 + (ulong)uVar12 * 4 + 0xc) = (uint)bVar3;
                bVar20 = 1 << ((byte)uVar12 & 0x1f) != uVar17;
                uVar17 = uVar17 ^ 1 << (uVar12 & 0x1f);
              } while (bVar20);
            }
            if (*(uint *)(plVar8 + uVar18 * 3 + 0xb) != 0) {
              bVar3 = *(byte *)((long)plVar8 + uVar18 * 0x18 + 0x5e);
              uVar17 = *(uint *)(plVar8 + uVar18 * 3 + 0xb);
              do {
                if (bVar19 <= bVar3) {
                  bVar19 = bVar3;
                }
                uVar12 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                *(uint *)((long)&first[1].field_0 + (ulong)uVar12 * 4 + 0xc) = (uint)bVar3;
                bVar20 = 1 << ((byte)uVar12 & 0x1f) != uVar17;
                uVar17 = uVar17 ^ 1 << (uVar12 & 0x1f);
              } while (bVar20);
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar5);
          bVar19 = 0xf < bVar19;
        }
        if (((int)plVar8[1] < 0) && ((bool)bVar19 != false)) {
          iVar6 = *(int *)&first[1].field_0;
          if (iVar6 < 0x42e) {
            if (iVar6 < 0x38f) {
              if (iVar6 == 0x33a) {
                uVar14 = 0x33c;
              }
              else if (iVar6 == 0x340) {
                uVar14 = 0x342;
              }
              else {
                if (iVar6 != 0x38a) {
LAB_00137308:
                  DebugUtils::assertionFailed
                            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O1/_deps/asmjit-src/src/asmjit/x86/x86rapass.cpp"
                             ,0x4bc,"false");
                }
                uVar14 = 0x38b;
              }
            }
            else if (iVar6 == 0x38f) {
              uVar14 = 0x390;
            }
            else if (iVar6 == 0x40c) {
              uVar14 = 0x40d;
            }
            else {
              if (iVar6 != 0x411) goto LAB_00137308;
              uVar14 = 0x412;
            }
          }
          else if (iVar6 < 0x46f) {
            if (iVar6 == 0x42e) {
              uVar14 = 0x42f;
            }
            else if (iVar6 == 0x431) {
              uVar14 = 0x433;
            }
            else {
              if (iVar6 != 0x46d) goto LAB_00137308;
              uVar14 = 0x46e;
            }
          }
          else if (iVar6 == 0x46f) {
            uVar14 = 0x470;
          }
          else if (iVar6 == 0x540) {
            uVar14 = 0x541;
          }
          else {
            if (iVar6 != 0x5a0) goto LAB_00137308;
            uVar14 = 0x5a1;
          }
          *(undefined4 *)&first[1].field_0 = uVar14;
        }
        first->_passData = (void *)0x0;
        bVar20 = true;
        if ((first->field_1)._any._nodeType == '\x11') {
          lVar16 = *plVar8;
          bVar21 = BaseRAPass::isNextTo
                             (&this->super_BaseRAPass,first,
                              &((this->super_BaseRAPass)._func)->_exitNode->super_BaseNode);
          if (!bVar21) {
            ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
                 (first->field_0).field_0._prev;
            local_3c = ((this->super_BaseRAPass)._func)->_exitNode->_labelId;
            local_40 = 4;
            local_38 = 0;
            EVar13 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                               (this,&local_40);
            if (EVar13 != 0) {
              bVar20 = false;
              local_5c = EVar13;
              goto LAB_0013715e;
            }
          }
          pBVar11 = (first->field_0).field_0._prev;
          BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
          *(BaseNode **)(lVar16 + 0x18) = pBVar11;
        }
LAB_0013715e:
        if (bVar20) goto LAB_00137167;
        bVar20 = false;
      }
      if (!bVar20) {
        pBVar15 = first;
      }
    }
    first = pBVar15;
    if (!bVar20) {
      return local_5c;
    }
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // If the instruction contains pass data (raInst) then it was a subject
        // for register allocation and must be rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            // Transform VEX instruction to EVEX.
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // This data is allocated by Zone passed to `runOnFunction()`, which
        // will be reset after the RA pass finishes. So reset this data to
        // prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        if (ASMJIT_UNLIKELY(node->type() != BaseNode::kNodeInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit
          // label is next to it (optimization) or patched to an architecture
          // dependent jump instruction that jumps to the function's exit before
          // the epilog.
          if (node->type() == BaseNode::kNodeFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

    node = next;
  }

  return kErrorOk;
}